

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

int re2::StringPieceToRune(Rune *r,StringPiece *sp,RegexpStatus *status)

{
  int iVar1;
  
  iVar1 = fullrune(sp->ptr_,sp->length_);
  if (iVar1 != 0) {
    iVar1 = chartorune(r,sp->ptr_);
    if (*r < 0x110000) {
      if (*r != 0xfffd || iVar1 != 1) {
        sp->ptr_ = sp->ptr_ + iVar1;
        sp->length_ = sp->length_ - iVar1;
        return iVar1;
      }
    }
    else {
      *r = 0xfffd;
    }
  }
  status->code_ = kRegexpBadUTF8;
  (status->error_arg_).ptr_ = (char *)0x0;
  (status->error_arg_).length_ = 0;
  return -1;
}

Assistant:

static int StringPieceToRune(Rune *r, StringPiece *sp, RegexpStatus* status) {
  int n;
  if (fullrune(sp->data(), sp->size())) {
    n = chartorune(r, sp->data());
    // Some copies of chartorune have a bug that accepts
    // encodings of values in (10FFFF, 1FFFFF] as valid.
    // Those values break the character class algorithm,
    // which assumes Runemax is the largest rune.
    if (*r > Runemax) {
      n = 1;
      *r = Runeerror;
    }
    if (!(n == 1 && *r == Runeerror)) {  // no decoding error
      sp->remove_prefix(n);
      return n;
    }
  }

  status->set_code(kRegexpBadUTF8);
  status->set_error_arg(NULL);
  return -1;
}